

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_op_sub_cc(TCGContext_conflict8 *tcg_ctx,TCGv_i32 dst,TCGv_i32 src1,TCGv_i32 src2)

{
  uintptr_t o_4;
  uintptr_t o_3;
  
  if ((TCGv_i32)tcg_ctx->cpu_cc_src != src1) {
    tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,
                        (TCGArg)((TCGv_i32)tcg_ctx->cpu_cc_src + (long)tcg_ctx),
                        (TCGArg)(src1 + (long)tcg_ctx));
  }
  if ((TCGv_i32)tcg_ctx->cpu_cc_src2 != src2) {
    tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,
                        (TCGArg)((TCGv_i32)tcg_ctx->cpu_cc_src2 + (long)tcg_ctx),
                        (TCGArg)(src2 + (long)tcg_ctx));
  }
  tcg_gen_sub_i64(tcg_ctx,(TCGv_i32)tcg_ctx->cpu_cc_dst,(TCGv_i32)tcg_ctx->cpu_cc_src,
                  (TCGv_i32)tcg_ctx->cpu_cc_src2);
  if ((TCGv_i32)tcg_ctx->cpu_cc_dst != dst) {
    tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(dst + (long)tcg_ctx),
                        (TCGArg)((TCGv_i32)tcg_ctx->cpu_cc_dst + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static inline void gen_op_sub_cc(TCGContext *tcg_ctx, TCGv dst, TCGv src1, TCGv src2)
{
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, src1);
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src2, src2);
    tcg_gen_sub_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, tcg_ctx->cpu_cc_src, tcg_ctx->cpu_cc_src2);
    tcg_gen_mov_tl(tcg_ctx, dst, tcg_ctx->cpu_cc_dst);
}